

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1d734c9::AV1FwdTxfm2dTest_DCTScaleTest_Test::TestBody
          (AV1FwdTxfm2dTest_DCTScaleTest_Test *this)

{
  TX_SIZE tx_size;
  int src_stride;
  int j;
  ulong uVar1;
  pointer *__ptr;
  SEARCH_METHODS *message;
  long lVar2;
  ulong uVar3;
  int iVar5;
  undefined1 auVar4 [16];
  int iVar6;
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int iVar20;
  int iVar21;
  int iVar24;
  undefined1 auVar22 [16];
  int iVar25;
  undefined1 auVar23 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar26 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar27 [16];
  AssertionResult gtest_ar;
  int16_t src_diff [1024];
  tran_low_t coeff [1024];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffe780;
  char in_stack_ffffffffffffe788;
  undefined7 in_stack_ffffffffffffe789;
  undefined8 *in_stack_ffffffffffffe790;
  undefined8 *puVar28;
  AssertHelper in_stack_ffffffffffffe798;
  char *in_stack_ffffffffffffe7a0;
  undefined2 auStack_1858 [1020];
  tran_low_t local_1060 [1036];
  long lVar8;
  
  lVar2 = 0;
  do {
    tx_size = (&DAT_00d02db6)[lVar2];
    src_stride = (&DAT_00d01ba0)[lVar2];
    uVar3 = (ulong)(src_stride * src_stride + (uint)(src_stride * src_stride == 0));
    memset(local_1060,0,uVar3 * 4);
    lVar8 = uVar3 - 1;
    auVar4._8_4_ = (int)lVar8;
    auVar4._0_8_ = lVar8;
    auVar4._12_4_ = (int)((ulong)lVar8 >> 0x20);
    auVar4 = auVar4 ^ _DAT_00c30d80;
    uVar1 = 0;
    auVar7 = _DAT_00c40100;
    auVar9 = _DAT_00c400f0;
    auVar10 = _DAT_00c400e0;
    auVar11 = _DAT_00c400d0;
    do {
      auVar12 = auVar7 ^ _DAT_00c30d80;
      iVar21 = auVar4._0_4_;
      iVar20 = -(uint)(iVar21 < auVar12._0_4_);
      iVar5 = auVar4._4_4_;
      auVar13._4_4_ = -(uint)(iVar5 < auVar12._4_4_);
      iVar25 = auVar4._8_4_;
      iVar24 = -(uint)(iVar25 < auVar12._8_4_);
      iVar6 = auVar4._12_4_;
      auVar13._12_4_ = -(uint)(iVar6 < auVar12._12_4_);
      auVar18._4_4_ = iVar20;
      auVar18._0_4_ = iVar20;
      auVar18._8_4_ = iVar24;
      auVar18._12_4_ = iVar24;
      auVar26 = pshuflw(in_XMM8,auVar18,0xe8);
      auVar16._4_4_ = -(uint)(auVar12._4_4_ == iVar5);
      auVar16._12_4_ = -(uint)(auVar12._12_4_ == iVar6);
      auVar16._0_4_ = auVar16._4_4_;
      auVar16._8_4_ = auVar16._12_4_;
      auVar27 = pshuflw(in_XMM9,auVar16,0xe8);
      auVar13._0_4_ = auVar13._4_4_;
      auVar13._8_4_ = auVar13._12_4_;
      auVar12 = pshuflw(auVar26,auVar13,0xe8);
      auVar12 = (auVar12 | auVar27 & auVar26) ^ _DAT_00d01b80;
      auVar12 = packssdw(auVar12,auVar12);
      if ((auVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)auStack_1858 + (uVar1 - 8)) = 8;
      }
      auVar13 = auVar16 & auVar18 | auVar13;
      auVar12 = packssdw(auVar13,auVar13);
      auVar12 = packssdw(auVar12 ^ _DAT_00d01b80,auVar12 ^ _DAT_00d01b80);
      if ((auVar12._0_4_ >> 0x10 & 1) != 0) {
        *(undefined2 *)((long)auStack_1858 + (uVar1 - 6)) = 8;
      }
      auVar16 = auVar9 ^ _DAT_00c30d80;
      iVar20 = -(uint)(iVar21 < auVar16._0_4_);
      auVar22._4_4_ = -(uint)(iVar5 < auVar16._4_4_);
      iVar24 = -(uint)(iVar25 < auVar16._8_4_);
      auVar22._12_4_ = -(uint)(iVar6 < auVar16._12_4_);
      auVar12._4_4_ = iVar20;
      auVar12._0_4_ = iVar20;
      auVar12._8_4_ = iVar24;
      auVar12._12_4_ = iVar24;
      auVar17._4_4_ = -(uint)(auVar16._4_4_ == iVar5);
      auVar17._12_4_ = -(uint)(auVar16._12_4_ == iVar6);
      auVar17._0_4_ = auVar17._4_4_;
      auVar17._8_4_ = auVar17._12_4_;
      auVar22._0_4_ = auVar22._4_4_;
      auVar22._8_4_ = auVar22._12_4_;
      auVar16 = auVar17 & auVar12 | auVar22;
      auVar16 = packssdw(auVar16,auVar16);
      auVar16 = packssdw(auVar16 ^ _DAT_00d01b80,auVar16 ^ _DAT_00d01b80);
      if ((auVar16 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)auStack_1858 + (uVar1 - 4)) = 8;
      }
      auVar12 = pshufhw(auVar12,auVar12,0x84);
      auVar18 = pshufhw(auVar17,auVar17,0x84);
      auVar13 = pshufhw(auVar12,auVar22,0x84);
      auVar12 = (auVar13 | auVar18 & auVar12) ^ _DAT_00d01b80;
      auVar12 = packssdw(auVar12,auVar12);
      if ((auVar12 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)auStack_1858 + (uVar1 - 2)) = 8;
      }
      auVar12 = auVar10 ^ _DAT_00c30d80;
      iVar20 = -(uint)(iVar21 < auVar12._0_4_);
      auVar15._4_4_ = -(uint)(iVar5 < auVar12._4_4_);
      iVar24 = -(uint)(iVar25 < auVar12._8_4_);
      auVar15._12_4_ = -(uint)(iVar6 < auVar12._12_4_);
      auVar19._4_4_ = iVar20;
      auVar19._0_4_ = iVar20;
      auVar19._8_4_ = iVar24;
      auVar19._12_4_ = iVar24;
      auVar16 = pshuflw(auVar16,auVar19,0xe8);
      auVar14._4_4_ = -(uint)(auVar12._4_4_ == iVar5);
      auVar14._12_4_ = -(uint)(auVar12._12_4_ == iVar6);
      auVar14._0_4_ = auVar14._4_4_;
      auVar14._8_4_ = auVar14._12_4_;
      in_XMM9 = pshuflw(auVar27 & auVar26,auVar14,0xe8);
      in_XMM9 = in_XMM9 & auVar16;
      auVar15._0_4_ = auVar15._4_4_;
      auVar15._8_4_ = auVar15._12_4_;
      auVar12 = pshuflw(auVar16,auVar15,0xe8);
      auVar12 = (auVar12 | in_XMM9) ^ _DAT_00d01b80;
      auVar12 = packssdw(auVar12,auVar12);
      if ((auVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)auStack_1858 + uVar1) = 8;
      }
      auVar15 = auVar14 & auVar19 | auVar15;
      auVar12 = packssdw(auVar15,auVar15);
      auVar12 = packssdw(auVar12 ^ _DAT_00d01b80,auVar12 ^ _DAT_00d01b80);
      if ((auVar12 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)auStack_1858 + uVar1 + 2) = 8;
      }
      auVar12 = auVar11 ^ _DAT_00c30d80;
      iVar21 = -(uint)(iVar21 < auVar12._0_4_);
      auVar23._4_4_ = -(uint)(iVar5 < auVar12._4_4_);
      iVar25 = -(uint)(iVar25 < auVar12._8_4_);
      auVar23._12_4_ = -(uint)(iVar6 < auVar12._12_4_);
      auVar26._4_4_ = iVar21;
      auVar26._0_4_ = iVar21;
      auVar26._8_4_ = iVar25;
      auVar26._12_4_ = iVar25;
      auVar27._4_4_ = -(uint)(auVar12._4_4_ == iVar5);
      auVar27._12_4_ = -(uint)(auVar12._12_4_ == iVar6);
      auVar27._0_4_ = auVar27._4_4_;
      auVar27._8_4_ = auVar27._12_4_;
      auVar23._0_4_ = auVar23._4_4_;
      auVar23._8_4_ = auVar23._12_4_;
      auVar12 = auVar27 & auVar26 | auVar23;
      auVar12 = packssdw(auVar12,auVar12);
      in_XMM8 = packssdw(auVar12 ^ _DAT_00d01b80,auVar12 ^ _DAT_00d01b80);
      if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)auStack_1858 + uVar1 + 4) = 8;
      }
      auVar12 = pshufhw(auVar26,auVar26,0x84);
      auVar13 = pshufhw(auVar27,auVar27,0x84);
      auVar16 = pshufhw(auVar12,auVar23,0x84);
      auVar12 = (auVar16 | auVar13 & auVar12) ^ _DAT_00d01b80;
      auVar12 = packssdw(auVar12,auVar12);
      if ((auVar12 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)auStack_1858 + uVar1 + 6) = 8;
      }
      lVar8 = auVar7._8_8_;
      auVar7._0_8_ = auVar7._0_8_ + 8;
      auVar7._8_8_ = lVar8 + 8;
      lVar8 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 8;
      auVar9._8_8_ = lVar8 + 8;
      lVar8 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 8;
      auVar10._8_8_ = lVar8 + 8;
      lVar8 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 8;
      auVar11._8_8_ = lVar8 + 8;
      uVar1 = uVar1 + 0x10;
    } while ((uVar3 * 2 + 0xe & 0xfffffffffffffff0) != uVar1);
    av1_quick_txfm(0,tx_size,(BitDepthInfo)0x8,(int16_t *)&stack0xffffffffffffe7a0,src_stride,
                   local_1060);
    uVar1 = 0;
    do {
      uVar1 = uVar1 + 1;
    } while (uVar3 != uVar1);
    testing::internal::DoubleNearPredFormat
              ((char *)in_stack_ffffffffffffe780._M_head_impl,(char *)0x6e7a5a,
               in_stack_ffffffffffffe7a0,(double)in_stack_ffffffffffffe798.data_,
               (double)in_stack_ffffffffffffe790,
               (double)CONCAT71(in_stack_ffffffffffffe789,in_stack_ffffffffffffe788));
    if (in_stack_ffffffffffffe788 == '\0') {
      testing::Message::Message((Message *)&stack0xffffffffffffe780);
      message = "";
      if (in_stack_ffffffffffffe790 != (undefined8 *)0x0) {
        message = (SEARCH_METHODS *)*in_stack_ffffffffffffe790;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffe798,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_fwd_txfm2d_test.cc"
                 ,0x192,(char *)message);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffe798,(Message *)&stack0xffffffffffffe780);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffe798);
      if (in_stack_ffffffffffffe780._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)in_stack_ffffffffffffe780._M_head_impl + 8))();
      }
    }
    puVar28 = in_stack_ffffffffffffe790;
    if (in_stack_ffffffffffffe790 != (undefined8 *)0x0) {
      if ((undefined8 *)*in_stack_ffffffffffffe790 != in_stack_ffffffffffffe790 + 2) {
        operator_delete((undefined8 *)*in_stack_ffffffffffffe790);
      }
      operator_delete(in_stack_ffffffffffffe790);
    }
    lVar2 = lVar2 + 1;
    in_stack_ffffffffffffe790 = puVar28;
  } while (lVar2 != 4);
  return;
}

Assistant:

TEST(AV1FwdTxfm2dTest, DCTScaleTest) {
  BitDepthInfo bd_info;
  bd_info.bit_depth = 8;
  bd_info.use_highbitdepth_buf = 0;
  DECLARE_ALIGNED(32, int16_t, src_diff[1024]);
  DECLARE_ALIGNED(32, tran_low_t, coeff[1024]);

  const TX_SIZE tx_size_list[4] = { TX_4X4, TX_8X8, TX_16X16, TX_32X32 };
  const int stride_list[4] = { 4, 8, 16, 32 };
  const int ref_scale_list[4] = { 64, 64, 64, 16 };

  for (int i = 0; i < 4; i++) {
    TX_SIZE tx_size = tx_size_list[i];
    int stride = stride_list[i];
    int array_size = stride * stride;

    for (int j = 0; j < array_size; j++) {
      src_diff[j] = 8;
      coeff[j] = 0;
    }

    av1_quick_txfm(/*use_hadamard=*/0, tx_size, bd_info, src_diff, stride,
                   coeff);

    double input_sse = 0;
    double output_sse = 0;
    for (int j = 0; j < array_size; j++) {
      input_sse += pow(src_diff[j], 2);
      output_sse += pow(coeff[j], 2);
    }

    double scale = output_sse / input_sse;

    EXPECT_NEAR(scale, ref_scale_list[i], 5);
  }
}